

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::
best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
::mutation(best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
           *this,local_context *ctx,bit_array *x)

{
  uint uVar1;
  unsigned_long *puVar2;
  result_type_conflict2 rVar3;
  result_type_conflict2 rVar4;
  uint uVar5;
  double *args;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  double dVar6;
  string_view fmt;
  string_view fmt_00;
  int i;
  double var_p;
  double val_p;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint uVar7;
  uint uVar8;
  result_type_conflict2 local_40;
  result_type_conflict2 local_38;
  
  dVar6 = (ctx->value_p_dist)._M_param._M_mean;
  if ((((dVar6 != 0.0) || (NAN(dVar6))) ||
      (dVar6 = (ctx->value_p_dist)._M_param._M_stddev, dVar6 != 0.0)) || (NAN(dVar6))) {
    do {
      do {
        local_40 = std::normal_distribution<double>::operator()
                             (&ctx->variable_p_dist,&ctx->rng,&(ctx->variable_p_dist)._M_param);
      } while (local_40 <= 0.0);
    } while (1.0 <= local_40);
    do {
      do {
        local_38 = std::normal_distribution<double>::operator()
                             (&ctx->value_p_dist,&ctx->rng,&(ctx->value_p_dist)._M_param);
      } while (local_38 < 0.0);
    } while (1.0 < local_38);
    args = &local_38;
    fmt._M_str = (char *)&local_40;
    fmt._M_len = (size_t)"- mutation variables {}% with  {}% of set\n";
    to_log<double,double>
              (_stdout,(FILE *)0x7,0x2a,fmt,args,
               (double *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    rVar4 = local_38;
    rVar3 = local_40;
    uVar7 = 0;
    uVar1 = (x->super_bit_array_impl).m_size;
    if (uVar1 != 0) {
      do {
        dVar6 = std::
                generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                          (&ctx->rng);
        uVar8 = uVar7;
        if (dVar6 < rVar3) {
          fmt_00._M_str = &stack0xffffffffffffffac;
          fmt_00._M_len = (size_t)"- mutate variable {}\n";
          to_log<int>(_stdout,(FILE *)0x9,0x15,fmt_00,(int *)args);
          uVar8 = uVar7;
          dVar6 = std::
                  generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                            (&ctx->rng);
          uVar5 = uVar7 + 0x3f;
          if (-1 < (int)uVar7) {
            uVar5 = uVar7;
          }
          puVar2 = (x->super_bit_array_impl).m_data._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          puVar2[(int)uVar5 >> 6] =
               (ulong)((uint)(dVar6 < rVar4) & (uint)(1L << ((ulong)uVar7 & 0x3f))) |
               puVar2[(int)uVar5 >> 6] & ~(1L << ((ulong)uVar7 & 0x3f));
        }
        uVar7 = uVar8 + 1;
      } while (uVar7 != uVar1);
    }
  }
  return;
}

Assistant:

void mutation(local_context& ctx, bit_array& x)
    {
        if (ctx.value_p_dist.mean() == 0.0 && ctx.value_p_dist.stddev() == 0.0)
            return;

        double val_p, var_p;

        do
            var_p = ctx.variable_p_dist(ctx.rng);
        while (var_p <= 0.0 || var_p >= 1.0);

        do
            val_p = ctx.value_p_dist(ctx.rng);
        while (val_p < 0.0 || val_p > 1.0);

        to_log(stdout,
               7u,
               "- mutation variables {}% with "
               " {}% of set\n",
               var_p,
               val_p);

        std::bernoulli_distribution dist_var_p(var_p);
        std::bernoulli_distribution dist_value_p(val_p);

        for (int i = 0, e = x.size(); i != e; ++i) {
            if (dist_var_p(ctx.rng)) {
                to_log(stdout, 9u, "- mutate variable {}\n", i);

                x.set(i, dist_value_p(ctx.rng));
            }
        }
    }